

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void read_config_file(string *config_path)

{
  xml_node<char> *pxVar1;
  xml_node<char> *node;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  vector<char,_std::allocator<char>_> buffer;
  string sStack_10360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_10340;
  string dir_path;
  ifstream config_file;
  undefined8 auStack_10218 [36];
  xml_document<char> document;
  
  std::ifstream::ifstream(&config_file,(string *)config_path,_S_in);
  __first._8_8_ = 0xffffffffffffffff;
  __first._M_sbuf = *(streambuf_type **)((long)auStack_10218 + *(long *)(_config_file + -0x18));
  std::vector<char,std::allocator<char>>::
  vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((vector<char,std::allocator<char>> *)&buffer,__first,
             (istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40),
             (allocator_type *)&document);
  document.super_xml_node<char>.super_xml_base<char>.m_name =
       (char *)((ulong)document.super_xml_node<char>.super_xml_base<char>.m_name &
               0xffffffffffffff00);
  std::vector<char,_std::allocator<char>_>::emplace_back<char>(&buffer,(char *)&document);
  document.super_memory_pool<char>.m_end = (char *)&document.super_memory_pool<char>.m_alloc_func;
  document.super_xml_node<char>.m_contents = (char *)0x0;
  document.super_xml_node<char>.m_contents_size = 0;
  document.super_xml_node<char>.m_prev_sibling = (xml_node<char> *)0x0;
  document.super_xml_node<char>.m_next_sibling = (xml_node<char> *)0x0;
  document.super_xml_node<char>.m_first_attribute = (xml_attribute<char> *)0x0;
  document.super_xml_node<char>.m_last_attribute = (xml_attribute<char> *)0x0;
  document.super_xml_node<char>.m_first_node = (xml_node<char> *)0x0;
  document.super_xml_node<char>.m_last_node = (xml_node<char> *)0x0;
  document.super_memory_pool<char>.m_begin = document.super_memory_pool<char>.m_static_memory;
  document.super_memory_pool<char>.m_alloc_func = (alloc_func *)0x0;
  document.super_memory_pool<char>.m_free_func = (free_func *)0x0;
  document.super_xml_node<char>.super_xml_base<char>.m_name = (char *)0x0;
  document.super_xml_node<char>.super_xml_base<char>.m_value = (char *)0x0;
  document.super_xml_node<char>.super_xml_base<char>.m_name_size = 0;
  document.super_xml_node<char>.super_xml_base<char>.m_value_size = 0;
  document.super_xml_node<char>.super_xml_base<char>.m_parent = (xml_node<char> *)0x0;
  document.super_xml_node<char>.m_prefix = (char *)0x0;
  document.super_xml_node<char>.m_xmlns = (char *)0x0;
  document.super_xml_node<char>.m_prefix_size._0_4_ = 0;
  document.super_xml_node<char>.m_prefix_size._4_4_ = 0;
  document.super_xml_node<char>.m_xmlns_size._0_4_ = 0;
  document.super_xml_node<char>._68_8_ = 0;
  document.super_memory_pool<char>.m_nullstr = (char *)0x0;
  document.super_memory_pool<char>.m_xmlns_xml = (char *)0x0;
  document.super_memory_pool<char>.m_xmlns_xmlns = (char *)0x0;
  document.super_memory_pool<char>.m_ptr = document.super_memory_pool<char>.m_begin;
  rapidxml::xml_document<char>::parse<0>
            (&document,
             buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start,(xml_document<char> *)0x0);
  pxVar1 = rapidxml::xml_node<char>::first_node
                     (&document.super_xml_node<char>,"samples",(char *)0x0,0,0,true);
  get_dir(&sStack_10360,config_path);
  std::operator+(&bStack_10340,&sStack_10360,"/");
  std::operator+(&dir_path,&bStack_10340,"samples");
  std::__cxx11::string::~string((string *)&bStack_10340);
  std::__cxx11::string::~string((string *)&sStack_10360);
  node = rapidxml::xml_node<char>::first_node(pxVar1,"overlapping",(char *)0x0,0,0,true);
  for (; node != (xml_node<char> *)0x0;
      node = rapidxml::xml_node<char>::next_sibling(node,"overlapping",(char *)0x0,0,0,true)) {
    read_overlapping_instance(node);
  }
  pxVar1 = rapidxml::xml_node<char>::first_node(pxVar1,"simpletiled",(char *)0x0,0,0,true);
  for (; pxVar1 != (xml_node<char> *)0x0;
      pxVar1 = rapidxml::xml_node<char>::next_sibling(pxVar1,"simpletiled",(char *)0x0,0,0,true)) {
    read_simpletiled_instance(pxVar1,&dir_path);
  }
  std::__cxx11::string::~string((string *)&dir_path);
  rapidxml::memory_pool<char>::~memory_pool(&document.super_memory_pool<char>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buffer.super__Vector_base<char,_std::allocator<char>_>);
  std::ifstream::~ifstream(&config_file);
  return;
}

Assistant:

void read_config_file(const string &config_path) noexcept {
  ifstream config_file(config_path);
  vector<char> buffer((istreambuf_iterator<char>(config_file)),
                      istreambuf_iterator<char>());
  buffer.push_back('\0');
  xml_document<> document;
  document.parse<0>(&buffer[0]);

  xml_node<> *root_node = document.first_node("samples");
  string dir_path = get_dir(config_path) + "/" + "samples";
  for (xml_node<> *node = root_node->first_node("overlapping"); node;
       node = node->next_sibling("overlapping")) {
    read_overlapping_instance(node);
  }
  for (xml_node<> *node = root_node->first_node("simpletiled"); node;
       node = node->next_sibling("simpletiled")) {
    read_simpletiled_instance(node, dir_path);
  }
}